

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionContext::SetAssetReissuance
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Amount *amount,
          vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
          *issue_output_list,BlindFactor *blind_factor,BlindFactor *entropy)

{
  uint32_t tx_in_index;
  Amount *in_RCX;
  undefined8 in_RDX;
  ConfidentialTransaction *in_RSI;
  IssuanceParameter *in_RDI;
  BlindFactor *in_R9;
  BlindFactor *in_stack_00000008;
  uint32_t txin_index;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_locking_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_output_amount_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  *in_stack_00000360;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_stack_00000368;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_00000370;
  vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
  *in_stack_00000378;
  anon_class_1_0_00000001 *in_stack_00000380;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_ffffffffffffff50;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> local_78;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_60;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> local_48;
  BlindFactor *local_30;
  Amount *local_20;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector(&local_48);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector(&local_60);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            (&local_78);
  tx_in_index = (*(in_RSI->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])
                          (in_RSI,local_18);
  SetAssetReissuance::anon_class_1_0_00000001::operator()
            (in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
             in_stack_00000360);
  core::ConfidentialTransaction::SetAssetReissuance
            (in_RDI,in_RSI,tx_in_index,local_20,&local_48,&local_60,&local_78,local_30,
             in_stack_00000008);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&local_78);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_60);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            (in_stack_ffffffffffffff50);
  return in_RDI;
}

Assistant:

IssuanceParameter ConfidentialTransactionContext::SetAssetReissuance(
    const OutPoint& outpoint, const Amount& amount,
    const std::vector<IssuanceOutputParameter>& issue_output_list,
    const BlindFactor& blind_factor, const BlindFactor& entropy) {
  std::vector<Amount> asset_output_amount_list;
  std::vector<Script> asset_locking_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;

  static auto set_func = [](const std::vector<IssuanceOutputParameter>& list,
                            std::vector<Amount>* amount_list,
                            std::vector<Script>* locking_script_list,
                            std::vector<ConfidentialNonce>* nonce_list) {
    for (const auto& data : list) {
      ConfidentialNonce nonce;
      Script script;
      if (!data.direct_locking_script.IsEmpty()) {
        script = data.direct_locking_script;
      } else {
        Address addr;
        if (data.confidential_address.GetAddress().empty()) {
          addr = data.address;
        } else {
          addr = data.confidential_address.GetUnblindedAddress();
          if (!data.is_remove_nonce) {
            nonce = ConfidentialNonce(
                data.confidential_address.GetConfidentialKey());
          }
        }
        script = addr.GetLockingScript();
      }
      amount_list->push_back(data.amount);
      locking_script_list->push_back(script);
      nonce_list->push_back(nonce);
    }
    return;
  };

  uint32_t txin_index = GetTxInIndex(outpoint);
  set_func(
      issue_output_list, &asset_output_amount_list, &asset_locking_script_list,
      &asset_nonce_list);

  return SetAssetReissuance(
      txin_index, amount, asset_output_amount_list, asset_locking_script_list,
      asset_nonce_list, blind_factor, entropy);
}